

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O3

void __thiscall defyx::JitCompilerX86::h_IADD_RS(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  
  this->registerUsage[instr->dst] = i;
  puVar1 = this->code;
  iVar2 = this->codePos;
  (puVar1 + iVar2)[0] = 'O';
  (puVar1 + iVar2)[1] = 0x8d;
  iVar2 = this->codePos + 2;
  this->codePos = iVar2;
  bVar4 = 0xac;
  if (instr->dst != '\x05') {
    bVar4 = instr->dst * '\b' | 4;
  }
  this->code[iVar2] = bVar4;
  iVar2 = this->codePos;
  this->codePos = iVar2 + 1;
  this->code[(long)iVar2 + 1] = instr->src << 3 | (instr->mod & 0xc) << 4 | instr->dst;
  lVar3 = (long)this->codePos + 1;
  this->codePos = (int32_t)lVar3;
  if (instr->dst == '\x05') {
    *(uint32_t *)(this->code + lVar3) = instr->imm32;
    this->codePos = this->codePos + 4;
  }
  return;
}

Assistant:

void JitCompilerX86::h_IADD_RS(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		emit(REX_LEA);
		if (instr.dst == RegisterNeedsDisplacement)
			emitByte(0xac);
		else
			emitByte(0x04 + 8 * instr.dst);
		genSIB(instr.getModShift(), instr.src, instr.dst);
		if (instr.dst == RegisterNeedsDisplacement)
			emit32(instr.getImm32());
	}